

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BristolCircuit.cpp
# Opt level: O1

bool __thiscall
Circuit::base_circuit
          (Circuit *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *inputs,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *outputs)

{
  GateType GVar1;
  uint *puVar2;
  pointer puVar3;
  ulong uVar4;
  runtime_error *this_00;
  int iVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  pointer pGVar11;
  pointer pvVar12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> W;
  allocator_type local_31;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_30,(ulong)this->nWires,&local_31);
  if (this->nWires != 0) {
    uVar4 = 0;
    do {
      local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = 0xff;
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->nWires);
  }
  if ((this->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar4 = 0;
    iVar5 = 0;
    do {
      if ((this->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] != 0) {
        uVar7 = 0;
        do {
          local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[iVar5 + uVar7] =
               (inputs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start[iVar5 + uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar7 < (this->numI).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar4]);
        iVar5 = iVar5 + uVar7;
      }
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (uVar4 < (ulong)((long)(this->numI).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->numI).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  pGVar11 = (this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
      super__Vector_impl_data._M_finish != pGVar11) {
    uVar7 = 1;
    uVar4 = 0;
    do {
      GVar1 = pGVar11[uVar4];
      if (GVar1 - INV < 3) {
        if (GVar1 == INV) {
switchD_001054d3_caseD_2:
          pvVar12 = (this->GateO).
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          bVar9 = local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start
                  [*(this->GateI).
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar4].
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start] ^ 1;
        }
        else {
          if (GVar1 != EQW) {
            if (GVar1 == EQ) goto switchD_001054d3_caseD_3;
            goto switchD_001054d3_default;
          }
switchD_001054d3_caseD_4:
          pvVar12 = (this->GateO).
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          bVar9 = local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start
                  [*(this->GateI).
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar4].
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start];
        }
      }
      else {
        switch(GVar1) {
        case XOR:
          puVar2 = (this->GateI).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar4].
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          bVar9 = local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start[puVar2[1]] ^
                  local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start[*puVar2];
          break;
        case AND:
          puVar2 = (this->GateI).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar4].
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          bVar9 = local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start[puVar2[1]] &
                  local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start[*puVar2];
          break;
        case INV:
          goto switchD_001054d3_caseD_2;
        case EQ:
switchD_001054d3_caseD_3:
          local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start
          [*(this->GateO).
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar4].
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start] =
               **(uchar **)
                 &(this->GateI).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar4].
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data;
          goto LAB_0010559a;
        case EQW:
          goto switchD_001054d3_caseD_4;
        case MAND:
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"MAND not supported");
          goto LAB_001056bb;
        default:
switchD_001054d3_default:
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"not_implemented");
LAB_001056bb:
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pvVar12 = (this->GateO).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start
      [*pvVar12[uVar4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start] = bVar9;
LAB_0010559a:
      uVar4 = (ulong)uVar7;
      pGVar11 = (this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar7 = uVar7 + 1;
    } while (uVar4 < (ulong)((long)(this->GateT).
                                   super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pGVar11 >> 2));
  }
  puVar3 = (this->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = 0;
  lVar6 = (long)(this->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_finish - (long)puVar3;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 2;
    lVar8 = 0;
    do {
      uVar7 = (int)uVar4 + puVar3[lVar8];
      uVar4 = (ulong)uVar7;
      lVar8 = lVar8 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar8);
    uVar4 = (ulong)uVar7;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(outputs,uVar4);
  puVar3 = (this->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = this->nWires;
  lVar6 = (long)(this->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_finish - (long)puVar3;
  if (lVar6 != 0) {
    uVar4 = 0;
    do {
      uVar7 = uVar7 - puVar3[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uVar4 & 0xffffffff) < (ulong)(lVar6 >> 2));
  }
  if ((this->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar4 = 0;
    iVar5 = 0;
    do {
      if ((this->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] != 0) {
        uVar10 = 0;
        do {
          (outputs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar5 + uVar10] =
               local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7 + uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar10 < (this->numO).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4]);
        iVar5 = iVar5 + uVar10;
        uVar7 = uVar7 + uVar10;
      }
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (uVar4 < (ulong)((long)(this->numO).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->numO).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  if (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool Circuit::base_circuit(const vector<uint8_t> &inputs,
                           vector<uint8_t> &outputs) const {
  vector<uint8_t> W(nWires);
  for (unsigned int i = 0; i < nWires; i++) {
    W[i] = -1;
  }

  // Load inputs
  unsigned int cnt = 0;
  for (unsigned int i = 0; i < numI.size(); i++) {
    for (unsigned int j = 0; j < numI[i]; j++) {
      W[cnt] = inputs[cnt];
      cnt++;
    }
  }

  // Evaluate the circuit
  for (unsigned int i = 0; i < GateT.size();
       i++) { // First check if ordering is broken
    if (GateT[i] != EQ && W[GateI[i][0]] < 0) {
      throw std::runtime_error("Circuit error");
    }
    if (GateT[i] != INV && GateT[i] != EQ && GateT[i] != EQW) {
      for (unsigned int j = 1; j < GateO[i].size(); j++) {
        if (W[GateI[i][j]] < 0) {
          throw std::runtime_error("Circuit error");
        }
      }
    }
    // Now evaluate the gate
    if (GateT[i] == AND) {
      W[GateO[i][0]] = W[GateI[i][0]] & W[GateI[i][1]];
    } else if (GateT[i] == MAND) {

      throw std::runtime_error("MAND not supported");
      // for (unsigned int j= 0; j < GateO[i].size(); j++)
      //  {
      //    W[GateO[i][j]]= W[GateI[i][j]] & W[GateI[i][j + GateO[i].size()]];
      //  }
    } else if (GateT[i] == XOR) {
      W[GateO[i][0]] = W[GateI[i][0]] ^ W[GateI[i][1]];
    } else if (GateT[i] == EQ) {
      W[GateO[i][0]] = GateI[i][0];
    } else if (GateT[i] == EQW) {
      W[GateO[i][0]] = W[GateI[i][0]];
    } else if (GateT[i] == INV) {
      W[GateO[i][0]] = 1 ^ W[GateI[i][0]];
    } else {
      throw std::runtime_error("not_implemented");
    }
  }

  // Now produce the output
  outputs.resize(total_num_out());
  cnt = nWires;
  unsigned int cntOut = 0;
  for (unsigned int i = 0; i < numO.size(); i++) {
    cnt -= numO[i];
  }
  for (unsigned int i = 0; i < numO.size(); i++) {
    // outputs[i].resize(numO[i]);
    for (unsigned int j = 0; j < numO[i]; j++) {
      outputs[cntOut] = W[cnt];
      cnt++;
      cntOut++;
    }
  }
  return true;
}